

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonObject.cpp
# Opt level: O3

JsonString * __thiscall json::JsonObject::setString(JsonObject *this,string *name,string *value)

{
  size_t sVar1;
  _Head_base<0UL,_json::JsonNode_*,_false> _Var2;
  _Head_base<0UL,_json::JsonNode_*,_false> this_00;
  JsonString *pJVar3;
  mapped_type *pmVar4;
  
  this_00._M_head_impl = (JsonNode *)operator_new(0x30);
  JsonString::JsonString((JsonString *)this_00._M_head_impl,&this->super_JsonNode,value);
  pJVar3 = JsonNode::operator_cast_to_JsonString_(this_00._M_head_impl);
  sVar1 = this->childCounter;
  this->childCounter = sVar1 + 1;
  pmVar4 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JsonObject::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JsonObject::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JsonObject::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JsonObject::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->children,name);
  _Var2._M_head_impl =
       (pmVar4->node)._M_t.
       super___uniq_ptr_impl<json::JsonNode,_std::default_delete<json::JsonNode>_>._M_t.
       super__Tuple_impl<0UL,_json::JsonNode_*,_std::default_delete<json::JsonNode>_>.
       super__Head_base<0UL,_json::JsonNode_*,_false>._M_head_impl;
  (pmVar4->node)._M_t.super___uniq_ptr_impl<json::JsonNode,_std::default_delete<json::JsonNode>_>.
  _M_t.super__Tuple_impl<0UL,_json::JsonNode_*,_std::default_delete<json::JsonNode>_>.
  super__Head_base<0UL,_json::JsonNode_*,_false>._M_head_impl = this_00._M_head_impl;
  if (_Var2._M_head_impl != (JsonNode *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_JsonNode + 8))();
  }
  pmVar4->orderIndex = sVar1;
  return pJVar3;
}

Assistant:

JsonString &JsonObject::setString(const std::string &name, std::string &&value)
    {
        std::unique_ptr<JsonNode> child(new JsonString(this, std::move(value)));
        JsonString &ref = *child;
        children[name] = {std::move(child), childCounter++};
        return ref;
    }